

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c++
# Opt level: O0

int __thiscall kj::Url::clone(Url *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  code cVar1;
  String *params;
  anon_class_1_0_00000001 local_151;
  Maybe<kj::String> local_150;
  anon_class_1_0_00000001 local_129;
  Mapper<const_kj::Vector<kj::Url::QueryParam>_&> local_128;
  Array<kj::Url::QueryParam> local_120;
  Vector<kj::Url::QueryParam> local_108;
  anon_class_1_0_00000001 local_e1;
  Mapper<const_kj::Vector<kj::String>_&> local_e0;
  Array<kj::String> local_d8;
  Vector<kj::String> local_c0;
  String local_a0;
  anon_class_1_0_00000001 local_71;
  Maybe<kj::Url::UserInfo> local_70;
  String local_30;
  __fn *local_18;
  Url *this_local;
  
  local_18 = __fn;
  this_local = this;
  str<kj::String_const&>(&local_30,(kj *)__fn,(String *)__child_stack);
  Maybe<kj::Url::UserInfo>::
  map<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_url_c__:145:18)>
            (&local_70,(Maybe<kj::Url::UserInfo> *)(__fn + 0x18),&local_71);
  str<kj::String_const&>(&local_a0,(kj *)(__fn + 0x58),params);
  kj::_::Mapper<const_kj::Vector<kj::String>_&>::Mapper
            (&local_e0,(Vector<kj::String> *)(__fn + 0x70));
  kj::_::Mapper<const_kj::Vector<kj::String>_&>::
  operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_url_c__:152:5)>
            (&local_d8,&local_e0,&local_e1);
  Vector<kj::String>::Vector(&local_c0,&local_d8);
  cVar1 = __fn[0x90];
  kj::_::Mapper<const_kj::Vector<kj::Url::QueryParam>_&>::Mapper
            (&local_128,(Vector<kj::Url::QueryParam> *)(__fn + 0x98));
  kj::_::Mapper<const_kj::Vector<kj::Url::QueryParam>_&>::
  operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_url_c__:154:5)>
            (&local_120,&local_128,&local_129);
  Vector<kj::Url::QueryParam>::Vector(&local_108,&local_120);
  Maybe<kj::String>::
  map<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_url_c__:159:18)>
            (&local_150,(Maybe<kj::String> *)(__fn + 0xb8),&local_151);
  Url(this,&local_30,&local_70,&local_a0,&local_c0,(bool)((byte)cVar1 & 1),&local_108,&local_150,
      *(UrlOptions *)(__fn + 0xd8));
  Maybe<kj::String>::~Maybe(&local_150);
  Vector<kj::Url::QueryParam>::~Vector(&local_108);
  Array<kj::Url::QueryParam>::~Array(&local_120);
  Vector<kj::String>::~Vector(&local_c0);
  Array<kj::String>::~Array(&local_d8);
  String::~String(&local_a0);
  Maybe<kj::Url::UserInfo>::~Maybe(&local_70);
  String::~String(&local_30);
  return (int)this;
}

Assistant:

Url Url::clone() const {
  return {
    kj::str(scheme),
    userInfo.map([](const UserInfo& ui) -> UserInfo {
      return {
        kj::str(ui.username),
        ui.password.map([](const String& s) { return kj::str(s); })
      };
    }),
    kj::str(host),
    KJ_MAP(part, path) { return kj::str(part); },
    hasTrailingSlash,
    KJ_MAP(param, query) -> QueryParam {
      // Preserve the "allocated-ness" of `param.value` with this careful copy.
      return { kj::str(param.name), param.value.begin() == nullptr ? kj::String()
                                                                   : kj::str(param.value) };
    },
    fragment.map([](const String& s) { return kj::str(s); }),
    options
  };
}